

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O3

bool __thiscall QFileDialog::restoreState(QFileDialog *this,QByteArray *state)

{
  QFileDialogPrivate *this_00;
  QUrl QVar1;
  char cVar2;
  bool bVar3;
  QDataStream *pQVar4;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_lastVisitedDir>_> *this_01;
  QUrl *this_02;
  long in_FS_OFFSET;
  qint32 viewMode;
  qint32 v;
  qint32 marker;
  QUrl currentDirectory;
  QUrl local_c0;
  QArrayData *local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  ViewMode local_9c;
  int local_98;
  int local_94;
  QUrl local_90;
  QArrayDataPointer<QString> local_88;
  QArrayData *local_70;
  char *local_68;
  qsizetype local_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QFileDialogPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  local_70 = &((state->d).d)->super_QArrayData;
  local_68 = (state->d).ptr;
  local_60 = (state->d).size;
  if (local_70 != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&local_70->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)&local_70->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_48 = 0xaaaaaaaa;
  uStack_44 = 0xaaaaaaaa;
  uStack_40 = 0xaaaaaaaa;
  uStack_3c = 0xaaaaaaaa;
  local_58 = 0xaaaaaaaa;
  uStack_54 = 0xaaaaaaaa;
  uStack_50 = 0xaaaaaaaa;
  uStack_4c = 0xaaaaaaaa;
  QDataStream::QDataStream((QDataStream *)&local_58,&local_70,1);
  uStack_40 = 0xd;
  cVar2 = QDataStream::atEnd();
  if (cVar2 == '\0') {
    local_88.d = (Data *)0x0;
    local_88.ptr = (QString *)0x0;
    local_88.size = 0;
    this_02 = &local_90;
    local_90.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    QUrl::QUrl(this_02);
    local_94 = -0x55555556;
    local_98 = -0x55555556;
    local_9c = 0xaaaaaaaa;
    QDataStream::operator>>((QDataStream *)&local_58,&local_94);
    QDataStream::operator>>((QDataStream *)&local_58,&local_98);
    if ((local_94 == 0xbe) && (0xfffffffd < local_98 - 5U)) {
      pQVar4 = (QDataStream *)::operator>>((QDataStream *)&local_58,&this_00->splitterState);
      pQVar4 = QtPrivate::readArrayBasedContainer<QList<QUrl>>(pQVar4,&this_00->sidebarUrls);
      QtPrivate::readArrayBasedContainer<QList<QString>>(pQVar4,(QList<QString> *)&local_88);
      if (local_98 == 3) {
        local_b8 = (QArrayData *)0x0;
        uStack_b0 = 0;
        local_a8 = 0;
        ::operator>>((QDataStream *)&local_58,(QString *)&local_b8);
        QUrl::fromLocalFile((QString *)&local_c0);
        QVar1.d = local_90.d;
        local_90.d = local_c0.d;
        local_c0.d = QVar1.d;
        QUrl::~QUrl(&local_c0);
        if (local_b8 != (QArrayData *)0x0) {
          LOCK();
          (local_b8->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_b8,2,0x10);
          }
        }
      }
      else {
        ::operator>>((QDataStream *)&local_58,&local_90);
      }
      pQVar4 = (QDataStream *)::operator>>((QDataStream *)&local_58,&this_00->headerData);
      QDataStream::operator>>(pQVar4,(int *)&local_9c);
      this_01 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_lastVisitedDir>_>
                 *)QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_lastVisitedDir>_>
                   ::operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_lastVisitedDir>_>
                                 *)pQVar4);
      cVar2 = QUrl::isEmpty();
      if (cVar2 == '\0') {
        this_02 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_lastVisitedDir>_>
                  ::operator()(this_01);
      }
      setDirectoryUrl(this,this_02);
      setViewMode(this,local_9c);
      bVar3 = true;
      if (((this_00->super_QDialogPrivate).nativeDialogInUse == false) &&
         ((this_00->qFileDialogUi).d != (Ui_QFileDialog *)0x0)) {
        bVar3 = QFileDialogPrivate::restoreWidgetState(this_00,(QStringList *)&local_88,-1);
      }
    }
    else {
      bVar3 = false;
    }
    QUrl::~QUrl(&local_90);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_88);
  }
  else {
    bVar3 = false;
  }
  QDataStream::~QDataStream((QDataStream *)&local_58);
  if (local_70 != (QArrayData *)0x0) {
    LOCK();
    (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_70,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileDialog::restoreState(const QByteArray &state)
{
    Q_D(QFileDialog);
    QByteArray sd = state;
    QDataStream stream(&sd, QIODevice::ReadOnly);
    stream.setVersion(QDataStream::Qt_5_0);
    if (stream.atEnd())
        return false;
    QStringList history;
    QUrl currentDirectory;
    qint32 marker;
    qint32 v;
    qint32 viewMode;
    stream >> marker;
    stream >> v;
    // the code below only supports versions 3 and 4
    if (marker != QFileDialogMagic || (v != 3 && v != 4))
        return false;

    stream >> d->splitterState
           >> d->sidebarUrls
           >> history;
    if (v == 3) {
        QString currentDirectoryString;
        stream >> currentDirectoryString;
        currentDirectory = QUrl::fromLocalFile(currentDirectoryString);
    } else {
        stream >> currentDirectory;
    }
    stream >> d->headerData
           >> viewMode;

    setDirectoryUrl(lastVisitedDir()->isEmpty() ? currentDirectory : *lastVisitedDir());
    setViewMode(static_cast<QFileDialog::ViewMode>(viewMode));

    if (!d->usingWidgets())
        return true;

    return d->restoreWidgetState(history, -1);
}